

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superscalar.cpp
# Opt level: O3

void __thiscall
randomx::SuperscalarInstructionInfo::SuperscalarInstructionInfo<3ul>
          (SuperscalarInstructionInfo *this,char *name,SuperscalarInstructionType type,
          MacroOp (*arr) [3],int resultOp,int dstOp,int srcOp)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  iterator __position;
  long lVar4;
  MacroOp MStack_48;
  
  this->name_ = name;
  this->type_ = type;
  (this->ops_).super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ops_).super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->ops_).super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->ops_).super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  this->resultOp_ = resultOp;
  this->dstOp_ = dstOp;
  this->srcOp_ = srcOp;
  lVar4 = 0;
  __position._M_current = (MacroOp *)0x0;
  do {
    puVar1 = (undefined8 *)((long)&(*arr)[0].name_ + lVar4);
    MStack_48.name_ = (char *)*puVar1;
    uVar2 = puVar1[1];
    puVar1 = (undefined8 *)((long)&(*arr)[0].size_ + lVar4 + 1);
    uVar3 = puVar1[1];
    MStack_48.uop1_._0_1_ = (undefined1)((ulong)*puVar1 >> 0x38);
    MStack_48._17_7_ = SUB87(uVar3,0);
    MStack_48.dependent_ = SUB81((ulong)uVar3 >> 0x38,0);
    MStack_48.size_._0_1_ = (undefined1)uVar2;
    MStack_48._9_7_ = SUB87((ulong)uVar2 >> 8,0);
    if (__position._M_current ==
        (this->ops_).super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>::
      _M_realloc_insert<randomx::MacroOp>(&this->ops_,__position,&MStack_48);
      __position._M_current =
           (this->ops_).super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>.
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (__position._M_current)->uop1_ = (int)CONCAT71(MStack_48._17_7_,(undefined1)MStack_48.uop1_);
      (__position._M_current)->uop2_ = MStack_48.uop2_;
      *(ulong *)&(__position._M_current)->dependent_ =
           CONCAT71(MStack_48._25_7_,MStack_48.dependent_);
      (__position._M_current)->name_ = MStack_48.name_;
      (__position._M_current)->size_ = (int)uVar2;
      (__position._M_current)->latency_ = (int)((ulong)uVar2 >> 0x20);
      __position._M_current =
           (this->ops_).super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
      (this->ops_).super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current;
    }
    this->latency_ = this->latency_ + __position._M_current[-1].latency_;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0x60);
  return;
}

Assistant:

SuperscalarInstructionInfo(const char* name, SuperscalarInstructionType type, const MacroOp(&arr)[N], int resultOp, int dstOp, int srcOp)
			: name_(name), type_(type), latency_(0), resultOp_(resultOp), dstOp_(dstOp), srcOp_(srcOp) {
			for (unsigned i = 0; i < N; ++i) {
				ops_.push_back(MacroOp(arr[i]));
				latency_ += ops_.back().getLatency();
			}
			static_assert(N > 1, "Invalid array size");
		}